

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::handleConstructor
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *node,TType *type)

{
  TIntermediate *pTVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermAggregate *pTVar5;
  undefined4 extraout_var_02;
  TIntermSymbol *left;
  TIntermBinary *right;
  TIntermAggregate *initializer;
  TIntermTyped *right_00;
  TIntermSymbol *copy;
  TIntermAggregate *seq;
  TType *type_local;
  TIntermTyped *node_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  if (node == (TIntermTyped *)0x0) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = TType::operator==(type,(TType *)CONCAT44(extraout_var,iVar3));
    this_local = (HlslParseContext *)node;
    if (!bVar2) {
      uVar4 = (*type->_vptr_TType[0x25])();
      if (((uVar4 & 1) == 0) || (bVar2 = isScalarConstructor(this,&node->super_TIntermNode), !bVar2)
         ) {
        this_local = (HlslParseContext *)addConstructor(this,loc,node,type);
      }
      else {
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])();
        if ((CONCAT44(extraout_var_00,iVar3) == 0) &&
           (iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(),
           CONCAT44(extraout_var_01,iVar3) == 0)) {
          pTVar5 = TIntermediate::makeAggregate
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc)
          ;
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])();
          left = makeInternalVariableNode
                           (this,loc,"scalarCopy",(TType *)CONCAT44(extraout_var_02,iVar3));
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          right = TIntermediate::addBinaryNode
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             EOpAssign,&left->super_TIntermTyped,node,loc);
          pTVar5 = TIntermediate::growAggregate(pTVar1,(TIntermNode *)pTVar5,(TIntermNode *)right);
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          initializer = TIntermediate::makeAggregate
                                  ((this->super_TParseContextBase).super_TParseVersions.intermediate
                                   ,loc);
          right_00 = convertInitializerList
                               (this,loc,type,(TIntermTyped *)initializer,&left->super_TIntermTyped)
          ;
          this_local = (HlslParseContext *)
                       TIntermediate::growAggregate
                                 (pTVar1,(TIntermNode *)pTVar5,&right_00->super_TIntermNode);
          TIntermOperator::setOp((TIntermOperator *)this_local,EOpComma);
          (*((TIntermNode *)
            &(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)->
            _vptr_TIntermNode[0x1d])(this_local,type);
        }
        else {
          pTVar5 = TIntermediate::makeAggregate
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,loc)
          ;
          this_local = (HlslParseContext *)
                       convertInitializerList(this,loc,type,(TIntermTyped *)pTVar5,node);
        }
      }
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::handleConstructor(const TSourceLoc& loc, TIntermTyped* node, const TType& type)
{
    if (node == nullptr)
        return nullptr;

    // Construct identical type
    if (type == node->getType())
        return node;

    // Handle the idiom "(struct type)<scalar value>"
    if (type.isStruct() && isScalarConstructor(node)) {
        // 'node' will almost always get used multiple times, so should not be used directly,
        // it would create a DAG instead of a tree, which might be okay (would
        // like to formalize that for constants and symbols), but if it has
        // side effects, they would get executed multiple times, which is not okay.
        if (node->getAsConstantUnion() == nullptr && node->getAsSymbolNode() == nullptr) {
            TIntermAggregate* seq = intermediate.makeAggregate(loc);
            TIntermSymbol* copy = makeInternalVariableNode(loc, "scalarCopy", node->getType());
            seq = intermediate.growAggregate(seq, intermediate.addBinaryNode(EOpAssign, copy, node, loc));
            seq = intermediate.growAggregate(seq, convertInitializerList(loc, type, intermediate.makeAggregate(loc), copy));
            seq->setOp(EOpComma);
            seq->setType(type);
            return seq;
        } else
            return convertInitializerList(loc, type, intermediate.makeAggregate(loc), node);
    }

    return addConstructor(loc, node, type);
}